

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O1

void __thiscall cppnet::Thread::~Thread(Thread *this)

{
  thread *ptVar1;
  
  this->_vptr_Thread = (_func_int **)&PTR__Thread_00124fd0;
  ptVar1 = (this->_thread)._M_t.
           super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
           super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (ptVar1 != (thread *)0x0) {
    if ((ptVar1->_M_id)._M_thread != 0) {
      std::terminate();
    }
    operator_delete(ptVar1);
  }
  (this->_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  return;
}

Assistant:

virtual ~Thread() {}